

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeBrOn(TranslateToFuzzReader *this,Type type)

{
  Name name;
  Name name_00;
  bool bVar1;
  BrOnOp op_00;
  Nullability nullable;
  value_type *ppEVar2;
  HeapType heapType;
  Expression *pEVar3;
  BrOn *pBVar4;
  bool local_181;
  Type local_150;
  uintptr_t local_148;
  uintptr_t local_140;
  uintptr_t local_138;
  Expression *local_130;
  uintptr_t local_128;
  uintptr_t local_120;
  Type local_118;
  uintptr_t local_110;
  Type local_108;
  uintptr_t local_100;
  uintptr_t local_f8;
  uintptr_t local_f0;
  Expression *local_e8;
  uintptr_t local_e0;
  HeapType local_d8;
  Type local_d0;
  Type local_c8;
  Type refType;
  Type castType;
  Type TStack_b0;
  BrOnOp op;
  uintptr_t local_a8;
  size_t local_a0;
  char *local_98;
  BasicType local_8c;
  undefined1 local_88 [8];
  anon_class_16_2_3fee0b3d fixFlowingType;
  BasicType local_6c;
  uintptr_t local_68;
  string_view local_60;
  Expression *local_50;
  Expression *target;
  Type targetType;
  Name targetName;
  int tries;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                    (&this->funcContext->breakableStack);
  if (bVar1) {
    type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
  }
  else {
    targetName.super_IString.str._M_str._4_4_ = (this->fuzzParams->super_FuzzParams).TRIES;
    Name::Name((Name *)&targetType);
    Type::Type((Type *)&target);
    do {
      targetName.super_IString.str._M_str._4_4_ = targetName.super_IString.str._M_str._4_4_ + -1;
      if (targetName.super_IString.str._M_str._4_4_ < 0) break;
      ppEVar2 = pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                          (this,&this->funcContext->breakableStack);
      local_50 = *ppEVar2;
      local_60 = (string_view)getTargetName(this,local_50);
      Name::operator=((Name *)&targetType,(Name *)&local_60);
      local_68 = (uintptr_t)getTargetType(this,local_50);
      target = (Expression *)local_68;
      bVar1 = Type::isRef((Type *)&target);
      local_181 = true;
      if (!bVar1) {
        local_6c = none;
        local_181 = Type::operator==((Type *)&target,&local_6c);
      }
    } while (local_181 == false);
    if (targetName.super_IString.str._M_str._4_4_ < 0) {
      fixFlowingType.this = this_local;
      type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
    }
    else {
      local_88 = (undefined1  [8])&this_local;
      local_8c = none;
      fixFlowingType.type = (Type *)this;
      bVar1 = Type::operator==((Type *)&target,&local_8c);
      if (bVar1) {
        local_a0 = targetType.id;
        local_98 = (char *)targetName.super_IString.str._M_len;
        local_a8 = (uintptr_t)getReferenceType(this);
        pEVar3 = make(this,(Type)local_a8);
        Type::Type(&stack0xffffffffffffff50,none);
        name_00.super_IString.str._M_str = local_98;
        name_00.super_IString.str._M_len = local_a0;
        pBVar4 = Builder::makeBrOn(&this->builder,BrOnNull,name_00,pEVar3,TStack_b0);
        type_local.id =
             (uintptr_t)
             makeBrOn::anon_class_16_2_3fee0b3d::operator()
                       ((anon_class_16_2_3fee0b3d *)local_88,(Expression *)pBVar4);
      }
      else {
        bVar1 = Type::isRef((Type *)&target);
        if (!bVar1) {
          __assert_fail("targetType.isRef()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                        ,0x131e,"Expression *wasm::TranslateToFuzzReader::makeBrOn(Type)");
        }
        op_00 = pick<wasm::BrOnOp,wasm::BrOnOp,wasm::BrOnOp>(this,BrOnNonNull,BrOnCast,BrOnCastFail)
        ;
        Type::Type(&refType,none);
        Type::Type(&local_c8);
        if (op_00 == BrOnNonNull) {
          local_d8 = Type::getHeapType((Type *)&target);
          nullable = getNullability(this);
          Type::Type(&local_d0,local_d8,nullable,Inexact);
          local_c8.id = local_d0.id;
        }
        else if (op_00 == BrOnCast) {
          local_e8 = target;
          local_e0 = (uintptr_t)getSubType(this,(Type)target);
          refType.id = local_e0;
          bVar1 = oneIn(this,5);
          if (bVar1) {
            local_f8 = refType.id;
            local_f0 = (uintptr_t)getSubType(this,refType);
          }
          else {
            local_100 = refType.id;
            local_f0 = (uintptr_t)getSuperType(this,refType);
          }
          local_c8.id = local_f0;
          bVar1 = Type::isNonNullable((Type *)&target);
          if (((bVar1) && (bVar1 = Type::isNonNullable(&local_c8), !bVar1)) &&
             (bVar1 = Type::isNonNullable(&refType), !bVar1)) {
            bVar1 = oneIn(this,2);
            if (bVar1) {
              local_110 = (uintptr_t)Type::getHeapType(&local_c8);
              Type::Type(&local_108,(HeapType)local_110,NonNullable,Inexact);
              local_c8.id = local_108.id;
            }
            else {
              local_120 = (uintptr_t)Type::getHeapType(&refType);
              Type::Type(&local_118,(HeapType)local_120,NonNullable,Inexact);
              refType.id = local_118.id;
            }
          }
        }
        else {
          if (op_00 != BrOnCastFail) {
            ::wasm::handle_unreachable
                      ("bad br_on op",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                       ,0x1350);
          }
          local_130 = target;
          local_128 = (uintptr_t)getSubType(this,(Type)target);
          local_c8 = (Type)local_128;
          bVar1 = oneIn(this,5);
          if (bVar1) {
            local_140 = local_c8.id;
            local_138 = (uintptr_t)getSuperType(this,local_c8);
          }
          else {
            local_148 = local_c8.id;
            local_138 = (uintptr_t)getSubType(this,local_c8);
          }
          refType.id = local_138;
          bVar1 = Type::isNonNullable(&refType);
          if ((bVar1) && (bVar1 = oneIn(this,2), bVar1)) {
            heapType = Type::getHeapType(&refType);
            Type::Type(&local_150,heapType,Nullable,Inexact);
            refType.id = local_150.id;
          }
        }
        pEVar3 = make(this,local_c8);
        name.super_IString.str._M_str = (char *)targetName.super_IString.str._M_len;
        name.super_IString.str._M_len = targetType.id;
        pBVar4 = Builder::makeBrOn(&this->builder,op_00,name,pEVar3,refType);
        type_local.id =
             (uintptr_t)
             makeBrOn::anon_class_16_2_3fee0b3d::operator()
                       ((anon_class_16_2_3fee0b3d *)local_88,(Expression *)pBVar4);
      }
    }
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeBrOn(Type type) {
  if (funcContext->breakableStack.empty()) {
    return makeTrivial(type);
  }
  // We need to find a proper target to break to; try a few times. Finding the
  // target is harder than flowing out the proper type, so focus on the target,
  // and fix up the flowing type later. That is, once we find a target to break
  // to, we can then either drop ourselves or wrap ourselves in a block +
  // another value, so that we return the proper thing here (which is done below
  // in fixFlowingType).
  int tries = fuzzParams->TRIES;
  Name targetName;
  Type targetType;
  while (--tries >= 0) {
    auto* target = pick(funcContext->breakableStack);
    targetName = getTargetName(target);
    targetType = getTargetType(target);
    // We can send any reference type, or no value at all, but nothing else.
    if (targetType.isRef() || targetType == Type::none) {
      break;
    }
  }
  if (tries < 0) {
    return makeTrivial(type);
  }

  auto fixFlowingType = [&](Expression* brOn) -> Expression* {
    if (Type::isSubType(brOn->type, type)) {
      // Already of the proper type.
      return brOn;
    }
    if (type == Type::none) {
      // We just need to drop whatever it is.
      return builder.makeDrop(brOn);
    }
    // We need to replace the type with something else. Drop the BrOn if we need
    // to, and append a value with the proper type.
    if (brOn->type != Type::none) {
      brOn = builder.makeDrop(brOn);
    }
    return builder.makeSequence(brOn, make(type));
  };

  // We found something to break to. Figure out which BrOn variants we can
  // send.
  if (targetType == Type::none) {
    // BrOnNull is the only variant that sends no value.
    return fixFlowingType(
      builder.makeBrOn(BrOnNull, targetName, make(getReferenceType())));
  }

  // We are sending a reference type to the target. All other BrOn variants can
  // do that.
  assert(targetType.isRef());
  auto op = pick(BrOnNonNull, BrOnCast, BrOnCastFail);
  Type castType = Type::none;
  Type refType;
  switch (op) {
    case BrOnNonNull: {
      // The sent type is the non-nullable version of the reference, so any ref
      // of that type is ok, nullable or not.
      refType = Type(targetType.getHeapType(), getNullability());
      break;
    }
    case BrOnCast: {
      // The sent type is the heap type we cast to, with the input type's
      // nullability, so the combination of the two must be a subtype of
      // targetType.
      castType = getSubType(targetType);
      // The ref's type must be castable to castType, or we'd not validate. But
      // it can also be a subtype, which will trivially also succeed (so do that
      // more rarely). Pick subtypes rarely, as they make the cast trivial.
      refType = oneIn(5) ? getSubType(castType) : getSuperType(castType);
      if (targetType.isNonNullable()) {
        // And it must have the right nullability for the target, as mentioned
        // above: if the target type is non-nullable then either the ref or the
        // cast types must be.
        if (!refType.isNonNullable() && !castType.isNonNullable()) {
          // Pick one to make non-nullable.
          if (oneIn(2)) {
            refType = Type(refType.getHeapType(), NonNullable);
          } else {
            castType = Type(castType.getHeapType(), NonNullable);
          }
        }
      }
      break;
    }
    case BrOnCastFail: {
      // The sent type is the ref's type, with adjusted nullability (if the cast
      // allows nulls then no null can fail the cast, and what is sent is non-
      // nullable). First, pick a ref type that we can send to the target.
      refType = getSubType(targetType);
      // See above on BrOnCast, but flipped.
      castType = oneIn(5) ? getSuperType(refType) : getSubType(refType);
      // There is no nullability to adjust: if targetType is non-nullable then
      // both refType and castType are as well, as subtypes of it. But we can
      // also allow castType to be nullable (it is not sent to the target).
      if (castType.isNonNullable() && oneIn(2)) {
        castType = Type(castType.getHeapType(), Nullable);
      }
    } break;
    default: {
      WASM_UNREACHABLE("bad br_on op");
    }
  }
  return fixFlowingType(
    builder.makeBrOn(op, targetName, make(refType), castType));
}